

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O3

void logfopen(LogContext *ctx)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  Filename *pFVar5;
  strbuf *buf_o;
  byte *pbVar6;
  __int32_t **pp_Var7;
  size_t sVar8;
  char *__format;
  byte *pbVar9;
  uint uVar10;
  byte bVar11;
  tm tm;
  byte local_98;
  byte local_97;
  byte *local_70;
  tm local_68;
  
  if (ctx->state != L_CLOSED) {
    return;
  }
  if (ctx->logtype != 0) {
    ltime();
    if (ctx->currlogfilename != (Filename *)0x0) {
      filename_free(ctx->currlogfilename);
    }
    pFVar5 = conf_get_filename(ctx->conf,0x81);
    local_70 = (byte *)conf_get_str(ctx->conf,0);
    uVar3 = conf_get_int(ctx->conf,1);
    buf_o = strbuf_new();
    pbVar6 = (byte *)filename_to_str(pFVar5);
    bVar11 = *pbVar6;
    if (bVar11 != 0) {
      do {
        pbVar9 = pbVar6 + 1;
        if (bVar11 == 0x26) {
          bVar1 = *pbVar9;
          if ((ulong)bVar1 == 0) break;
          pbVar9 = pbVar6 + 2;
          pp_Var7 = __ctype_tolower_loc();
          pbVar6 = local_70;
          iVar4 = (*pp_Var7)[bVar1];
          if (iVar4 < 0x70) {
            if (iVar4 == 100) {
              __format = "%d";
            }
            else {
              if (iVar4 == 0x68) {
                sVar8 = strlen((char *)local_70);
                iVar4 = (int)sVar8;
                goto LAB_00132251;
              }
              if (iVar4 != 0x6d) {
LAB_001321fe:
                local_98 = 0x26;
                iVar4 = 1;
                if (bVar1 != 0x26) {
                  local_97 = bVar1;
                  iVar4 = 2;
                }
                pbVar6 = &local_98;
                goto LAB_00132256;
              }
              __format = "%m";
            }
LAB_00132244:
            pbVar6 = &local_98;
            sVar8 = strftime((char *)pbVar6,0x20,__format,&local_68);
            iVar4 = (int)sVar8;
          }
          else {
            if (iVar4 != 0x70) {
              if (iVar4 == 0x74) {
                __format = "%H%M%S";
              }
              else {
                if (iVar4 != 0x79) goto LAB_001321fe;
                __format = "%Y";
              }
              goto LAB_00132244;
            }
            pbVar6 = &local_98;
            iVar4 = sprintf((char *)pbVar6,"%d",(ulong)uVar3);
          }
LAB_00132251:
          if (0 < iVar4) goto LAB_00132256;
        }
        else {
          local_98 = bVar11;
          iVar4 = 1;
          pbVar6 = &local_98;
LAB_00132256:
          uVar10 = iVar4 + 1;
          do {
            bVar1 = *pbVar6;
            if (bVar11 == 0x26) {
              bVar1 = filename_char_sanitise(bVar1);
            }
            pbVar6 = pbVar6 + 1;
            BinarySink_put_byte(buf_o->binarysink_,bVar1);
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
        bVar11 = *pbVar9;
        pbVar6 = pbVar9;
      } while (bVar11 != 0);
    }
    pFVar5 = filename_from_str(buf_o->s);
    strbuf_free(buf_o);
    ctx->currlogfilename = pFVar5;
    _Var2 = open_for_write_would_lose_data(pFVar5);
    iVar4 = 2;
    if (_Var2) {
      iVar4 = conf_get_int(ctx->conf,0x83);
      if (iVar4 == -1) {
        iVar4 = (*ctx->lp->vt->askappend)(ctx->lp,ctx->currlogfilename,logfopen_callback,ctx);
        if (iVar4 < 0) {
          ctx->state = L_OPENING;
          return;
        }
      }
      else {
        iVar4 = (iVar4 == 1) + 1;
      }
    }
    logfopen_callback(ctx,iVar4);
  }
  return;
}

Assistant:

void logfopen(LogContext *ctx)
{
    struct tm tm;
    int mode;

    /* Prevent repeat calls */
    if (ctx->state != L_CLOSED)
        return;

    if (!ctx->logtype)
        return;

    tm = ltime();

    /* substitute special codes in file name */
    if (ctx->currlogfilename)
        filename_free(ctx->currlogfilename);
    ctx->currlogfilename =
        xlatlognam(conf_get_filename(ctx->conf, CONF_logfilename),
                   conf_get_str(ctx->conf, CONF_host),
                   conf_get_int(ctx->conf, CONF_port), &tm);

    if (open_for_write_would_lose_data(ctx->currlogfilename)) {
        int logxfovr = conf_get_int(ctx->conf, CONF_logxfovr);
        if (logxfovr != LGXF_ASK) {
            mode = ((logxfovr == LGXF_OVR) ? 2 : 1);
        } else
            mode = lp_askappend(ctx->lp, ctx->currlogfilename,
                                logfopen_callback, ctx);
    } else
        mode = 2;                      /* create == overwrite */

    if (mode < 0)
        ctx->state = L_OPENING;
    else
        logfopen_callback(ctx, mode);  /* open the file */
}